

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDTernary * __thiscall
wasm::Builder::makeSIMDTernary
          (Builder *this,SIMDTernaryOp op,Expression *a,Expression *b,Expression *c)

{
  SIMDTernary *pSVar1;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDTernary>(&this->wasm->allocator);
  pSVar1->op = op;
  pSVar1->a = a;
  pSVar1->b = b;
  pSVar1->c = c;
  ::wasm::SIMDTernary::finalize();
  return pSVar1;
}

Assistant:

SIMDTernary* makeSIMDTernary(SIMDTernaryOp op,
                               Expression* a,
                               Expression* b,
                               Expression* c) {
    auto* ret = wasm.allocator.alloc<SIMDTernary>();
    ret->op = op;
    ret->a = a;
    ret->b = b;
    ret->c = c;
    ret->finalize();
    return ret;
  }